

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O2

void __thiscall RSA::print_last_ciphertext_line(RSA *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Cipher Text",&local_31);
  Crypto::print_header(&this->super_Crypto,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"Text: ");
  poVar2 = std::operator<<(poVar2,(string *)&(this->super_Crypto).cipherText);
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar1 = BigInt::isZero(&this->cipher_BigInt);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Num: ");
    poVar2 = operator<<(poVar2,&this->cipher_BigInt);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void RSA::print_last_ciphertext_line() {
    print_header("Cipher Text");
    cout << "Text: " << cipherText << endl;
    if (!cipher_BigInt.isZero())
        cout << "Num: " << cipher_BigInt << endl;

}